

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

char16_t * openjtalk_getHTSVoiceNameU16(OpenJTalk *oj,HtsVoiceFilelist *list,uint i,char16_t *name)

{
  bool bVar1;
  
  if (oj == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else if (list != (HtsVoiceFilelist *)0x0) {
    for (; list != (HtsVoiceFilelist *)0x0; list = list->succ) {
      bVar1 = i == 0;
      i = i - 1;
      if (bVar1) {
        memset(name,0,0x208);
        strcpyU16(name,(list->field_2).nameU16);
        return name;
      }
    }
  }
  return (char16_t *)0x0;
}

Assistant:

OPENJTALK_DLL_API char16_t *OPENJTALK_CONVENTION openjtalk_getHTSVoiceNameU16(OpenJTalk *oj, HtsVoiceFilelist *list, unsigned int i, char16_t *name)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return NULL;
	}

	if (list == NULL)
	{
		return NULL;
	}

	//HtsVoiceFilelist* temp = list;
	unsigned int counter = 0;
	for (HtsVoiceFilelist *temp = list; temp != NULL; temp = temp->succ)
	{
		if (counter++ == i)
		{
			if (temp)
			{
				clear_path_stringU16(name, MAX_PATH);
				strcpyU16(name, temp->nameU16);
				return name;
			}
			else
			{
				return NULL;
			}
		}
	}
	return NULL;
}